

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O2

DdNode * cuddSubsetHeavyBranch(DdManager *dd,DdNode *f,int numVars,int threshold)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  st__table *table;
  double **ppdVar5;
  double *pdVar6;
  NodeData_t **ppNVar7;
  NodeData_t *pNVar8;
  int **ppiVar9;
  int **__ptr;
  int *piVar10;
  st__table *table_00;
  DdNode *pDVar11;
  st__table *approxTable;
  st__generator *psVar12;
  double ***pppdVar13;
  int ***pppiVar14;
  long lVar15;
  long lVar16;
  double max;
  char *value;
  char *key;
  int *local_40;
  NodeData_t *currNodeQual;
  
  if (f == (DdNode *)0x0) {
    fwrite("Cannot subset, nil object\n",0x1a,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
    return (DdNode *)0x0;
  }
  one = Cudd_ReadOne(dd);
  zero = (DdNode *)((ulong)one ^ 1);
  iVar3 = 0x3ff;
  if (numVars != 0) {
    iVar3 = numVars;
  }
  if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
    return f;
  }
  ::max = ldexp(1.0,iVar3);
  ::max = ldexp(1.0,iVar3);
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) goto LAB_0074e611;
  maxPages = 0x80;
  ppdVar5 = (double **)malloc(0x400);
  mintermPages = ppdVar5;
  if (ppdVar5 == (double **)0x0) {
LAB_0074e609:
    st__free_table(table);
  }
  else {
    page = 0;
    pdVar6 = (double *)malloc(0x4000);
    currentMintermPage = pdVar6;
    *ppdVar5 = pdVar6;
    if (pdVar6 == (double *)0x0) {
      free(ppdVar5);
      pppdVar13 = &mintermPages;
LAB_0074e605:
      *pppdVar13 = (double **)0x0;
      goto LAB_0074e609;
    }
    pageIndex = 0;
    maxNodeDataPages = 0x80;
    ppNVar7 = (NodeData_t **)malloc(0x400);
    nodeDataPages = ppNVar7;
    if (ppNVar7 == (NodeData_t **)0x0) {
      bVar2 = true;
      lVar15 = 0;
      while (lVar16 = lVar15, bVar2) {
        bVar2 = false;
        lVar15 = 1;
        if (ppdVar5[lVar16] != (double *)0x0) {
          free(ppdVar5[lVar16]);
          ppdVar5[lVar16] = (double *)0x0;
          bVar2 = false;
        }
      }
      free(ppdVar5);
      pppdVar13 = &mintermPages;
      goto LAB_0074e605;
    }
    nodeDataPage = 0;
    pNVar8 = (NodeData_t *)malloc(0x6000);
    currentNodeDataPage = pNVar8;
    *ppNVar7 = pNVar8;
    if (pNVar8 == (NodeData_t *)0x0) {
      bVar2 = true;
      lVar15 = 0;
      while (lVar16 = lVar15, bVar2) {
        bVar2 = false;
        lVar15 = 1;
        if (ppdVar5[lVar16] != (double *)0x0) {
          free(ppdVar5[lVar16]);
          ppdVar5[lVar16] = (double *)0x0;
          bVar2 = false;
        }
      }
      free(ppdVar5);
      mintermPages = (double **)0x0;
      free(ppNVar7);
      pppdVar13 = (double ***)&nodeDataPages;
      goto LAB_0074e605;
    }
    nodeDataPageIndex = 0;
    SubsetCountMintermAux(f,::max,table);
    if (memOut == '\0') {
      max = ldexp(1.0,iVar3);
      maxPages = 0x80;
      ::max = max;
      ppiVar9 = (int **)malloc(0x400);
      nodePages = ppiVar9;
      if (ppiVar9 != (int **)0x0) {
        __ptr = (int **)malloc(0x400);
        ppdVar5 = mintermPages;
        lightNodePages = __ptr;
        if (__ptr == (int **)0x0) {
          iVar3 = page;
          if (page < 0) {
            iVar3 = -1;
          }
          for (lVar15 = 0; (long)iVar3 + 1 != lVar15; lVar15 = lVar15 + 1) {
            if (ppdVar5[lVar15] != (double *)0x0) {
              free(ppdVar5[lVar15]);
              ppdVar5[lVar15] = (double *)0x0;
            }
          }
          if (ppdVar5 != (double **)0x0) {
            free(ppdVar5);
            mintermPages = (double **)0x0;
          }
          ppNVar7 = nodeDataPages;
          iVar3 = -1;
          if (-1 < nodeDataPage) {
            iVar3 = nodeDataPage;
          }
          for (lVar15 = 0; (long)iVar3 + 1 != lVar15; lVar15 = lVar15 + 1) {
            if (ppNVar7[lVar15] != (NodeData_t *)0x0) {
              free(ppNVar7[lVar15]);
              ppNVar7[lVar15] = (NodeData_t *)0x0;
            }
          }
          if (ppNVar7 != (NodeData_t **)0x0) {
            free(ppNVar7);
            pppiVar14 = (int ***)&nodeDataPages;
            goto LAB_0074e859;
          }
        }
        else {
          page = 0;
          piVar10 = (int *)malloc(0x2000);
          *ppiVar9 = piVar10;
          ppdVar5 = mintermPages;
          currentNodePage = piVar10;
          if (piVar10 == (int *)0x0) {
            bVar2 = true;
            lVar15 = 0;
            while (lVar16 = lVar15, bVar2) {
              bVar2 = false;
              lVar15 = 1;
              if (ppdVar5[lVar16] != (double *)0x0) {
                free(ppdVar5[lVar16]);
                ppdVar5[lVar16] = (double *)0x0;
                bVar2 = false;
              }
            }
            if (ppdVar5 != (double **)0x0) {
              free(ppdVar5);
              mintermPages = (double **)0x0;
            }
            ppNVar7 = nodeDataPages;
            iVar3 = -1;
            if (-1 < nodeDataPage) {
              iVar3 = nodeDataPage;
            }
            for (lVar15 = 0; (long)iVar3 + 1 != lVar15; lVar15 = lVar15 + 1) {
              if (ppNVar7[lVar15] != (NodeData_t *)0x0) {
                free(ppNVar7[lVar15]);
                ppNVar7[lVar15] = (NodeData_t *)0x0;
              }
            }
            if (ppNVar7 != (NodeData_t **)0x0) {
              free(ppNVar7);
              nodeDataPages = (NodeData_t **)0x0;
            }
          }
          else {
            currentLightNodePage = (int *)malloc(0x2000);
            *__ptr = currentLightNodePage;
            ppdVar5 = mintermPages;
            if (currentLightNodePage != (int *)0x0) {
              pageIndex = 0;
              iVar3 = SubsetCountNodesAux(f,table,max);
              if (memOut == '\0') {
                iVar4 = st__lookup(table,(char *)f,(char **)&currNodeQual);
                if (iVar4 == 0) {
                  fwrite("Something is wrong, ought to be node quality table\n",0x33,1,
                         (FILE *)dd->err);
                  dd->errorCode = CUDD_INTERNAL_ERROR;
                }
                piVar10 = (int *)malloc(4);
                if (piVar10 != (int *)0x0) {
                  *piVar10 = iVar3;
                  table_00 = st__init_table(st__ptrcmp,st__ptrhash);
                  piVar1 = (int *)(((ulong)one & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  pDVar11 = Cudd_ReadOne(dd);
                  iVar3 = st__insert(table_00,(char *)pDVar11,(char *)0x0);
                  if (iVar3 == -10000) {
                    fwrite("Something wrong, st__table insert failed\n",0x29,1,(FILE *)dd->out);
                  }
                  approxTable = st__init_table(st__ptrcmp,st__ptrhash);
                  pDVar11 = BuildSubsetBdd(dd,f,piVar10,table,threshold,table_00,approxTable);
                  if (pDVar11 != (DdNode *)0x0) {
                    piVar1 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
                    *piVar1 = *piVar1 + 1;
                  }
                  psVar12 = st__init_gen(approxTable);
                  if (psVar12 != (st__generator *)0x0) {
                    local_40 = piVar10;
                    while (iVar3 = st__gen(psVar12,&key,&value), iVar3 != 0) {
                      Cudd_RecursiveDeref(dd,(DdNode *)value);
                    }
                    st__free_gen(psVar12);
                    st__free_table(approxTable);
                    psVar12 = st__init_gen(table_00);
                    approxTable = table_00;
                    if (psVar12 != (st__generator *)0x0) {
                      while (iVar3 = st__gen(psVar12,&key,&value), iVar3 != 0) {
                        Cudd_RecursiveDeref(dd,(DdNode *)key);
                      }
                      st__free_gen(psVar12);
                      st__free_table(table_00);
                      piVar10 = local_40;
                      ppdVar5 = mintermPages;
                      lVar16 = (long)page;
                      for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
                        if (ppdVar5[lVar15] != (double *)0x0) {
                          free(ppdVar5[lVar15]);
                          ppdVar5[lVar15] = (double *)0x0;
                        }
                      }
                      if (ppdVar5 != (double **)0x0) {
                        free(ppdVar5);
                        mintermPages = (double **)0x0;
                      }
                      ppiVar9 = nodePages;
                      for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
                        if (ppiVar9[lVar15] != (int *)0x0) {
                          free(ppiVar9[lVar15]);
                          ppiVar9[lVar15] = (int *)0x0;
                        }
                      }
                      if (ppiVar9 != (int **)0x0) {
                        free(ppiVar9);
                        nodePages = (int **)0x0;
                      }
                      ppiVar9 = lightNodePages;
                      for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
                        if (ppiVar9[lVar15] != (int *)0x0) {
                          free(ppiVar9[lVar15]);
                          ppiVar9[lVar15] = (int *)0x0;
                        }
                      }
                      if (ppiVar9 != (int **)0x0) {
                        free(ppiVar9);
                        lightNodePages = (int **)0x0;
                      }
                      ppNVar7 = nodeDataPages;
                      lVar16 = (long)nodeDataPage;
                      for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
                        if (ppNVar7[lVar15] != (NodeData_t *)0x0) {
                          free(ppNVar7[lVar15]);
                          ppNVar7[lVar15] = (NodeData_t *)0x0;
                        }
                      }
                      if (ppNVar7 != (NodeData_t **)0x0) {
                        free(ppNVar7);
                        nodeDataPages = (NodeData_t **)0x0;
                      }
                      st__free_table(table);
                      free(piVar10);
                      if (pDVar11 == (DdNode *)0x0) {
                        return (DdNode *)0x0;
                      }
                      piVar10 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
                      *piVar10 = *piVar10 + -1;
                      return pDVar11;
                    }
                  }
                  st__free_table(approxTable);
                  return (DdNode *)0x0;
                }
                goto LAB_0074e631;
              }
              goto LAB_0074e611;
            }
            bVar2 = true;
            lVar15 = 0;
            while (lVar16 = lVar15, bVar2) {
              bVar2 = false;
              lVar15 = 1;
              if (ppdVar5[lVar16] != (double *)0x0) {
                free(ppdVar5[lVar16]);
                ppdVar5[lVar16] = (double *)0x0;
                bVar2 = false;
              }
            }
            if (ppdVar5 != (double **)0x0) {
              free(ppdVar5);
              mintermPages = (double **)0x0;
            }
            ppNVar7 = nodeDataPages;
            iVar3 = -1;
            if (-1 < nodeDataPage) {
              iVar3 = nodeDataPage;
            }
            for (lVar15 = 0; (long)iVar3 + 1 != lVar15; lVar15 = lVar15 + 1) {
              if (ppNVar7[lVar15] != (NodeData_t *)0x0) {
                free(ppNVar7[lVar15]);
                ppNVar7[lVar15] = (NodeData_t *)0x0;
              }
            }
            if (ppNVar7 != (NodeData_t **)0x0) {
              free(ppNVar7);
              nodeDataPages = (NodeData_t **)0x0;
            }
            free(piVar10);
            currentNodePage = (int *)0x0;
          }
          free(__ptr);
          pppiVar14 = &lightNodePages;
LAB_0074e859:
          *pppiVar14 = (int **)0x0;
        }
        free(ppiVar9);
        nodePages = (int **)0x0;
      }
    }
  }
LAB_0074e611:
  memOut = '\x01';
  fwrite("Out-of-memory; Cannot subset\n",0x1d,1,(FILE *)dd->err);
LAB_0074e631:
  dd->errorCode = CUDD_MEMORY_OUT;
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddSubsetHeavyBranch(
  DdManager * dd /* DD manager */,
  DdNode * f /* current DD */,
  int  numVars /* maximum number of variables */,
  int  threshold /* threshold size for the subset */)
{

    int i, *size;
    st__table *visitedTable;
    int numNodes;
    NodeData_t *currNodeQual;
    DdNode *subset;
    st__table *storeTable, *approxTable;
    char *key, *value;
    st__generator *stGen;

    if (f == NULL) {
        fprintf(dd->err, "Cannot subset, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    one  = Cudd_ReadOne(dd);
    zero = Cudd_Not(one);

    /* If user does not know numVars value, set it to the maximum
     * exponent that the pow function can take. The -1 is due to the
     * discrepancy in the value that pow takes and the value that
     * log gives.
     */
    if (numVars == 0) {
        /* set default value */
        numVars = DBL_MAX_EXP - 1;
    }

    if (Cudd_IsConstant(f)) {
        return(f);
    }

    max = pow(2.0, (double)numVars);

    /* Create visited table where structures for node data are allocated and
       stored in a st__table */
    visitedTable = SubsetCountMinterm(f, numVars);
    if ((visitedTable == NULL) || memOut) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    numNodes = SubsetCountNodes(f, visitedTable, numVars);
    if (memOut) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    if ( st__lookup(visitedTable, (const char *)f, (char **)&currNodeQual) == 0) {
        fprintf(dd->err,
                "Something is wrong, ought to be node quality table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
    }

    size = ABC_ALLOC(int, 1);
    if (size == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    *size = numNodes;

#ifdef DEBUG
    num_calls = 0;
#endif
    /* table to store nodes being created. */
    storeTable = st__init_table( st__ptrcmp, st__ptrhash);
    /* insert the constant */
    cuddRef(one);
    if ( st__insert(storeTable, (char *)Cudd_ReadOne(dd), NIL(char)) ==
        st__OUT_OF_MEM) {
        fprintf(dd->out, "Something wrong, st__table insert failed\n");
    }
    /* table to store approximations of nodes */
    approxTable = st__init_table( st__ptrcmp, st__ptrhash);
    subset = (DdNode *)BuildSubsetBdd(dd, f, size, visitedTable, threshold,
                                      storeTable, approxTable);
    if (subset != NULL) {
        cuddRef(subset);
    }

    stGen = st__init_gen(approxTable);
    if (stGen == NULL) {
        st__free_table(approxTable);
        return(NULL);
    }
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(dd, (DdNode *)value);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(approxTable);

    stGen = st__init_gen(storeTable);
    if (stGen == NULL) {
        st__free_table(storeTable);
        return(NULL);
    }
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(dd, (DdNode *)key);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(storeTable);

    for (i = 0; i <= page; i++) {
        ABC_FREE(mintermPages[i]);
    }
    ABC_FREE(mintermPages);
    for (i = 0; i <= page; i++) {
        ABC_FREE(nodePages[i]);
    }
    ABC_FREE(nodePages);
    for (i = 0; i <= page; i++) {
        ABC_FREE(lightNodePages[i]);
    }
    ABC_FREE(lightNodePages);
    for (i = 0; i <= nodeDataPage; i++) {
        ABC_FREE(nodeDataPages[i]);
    }
    ABC_FREE(nodeDataPages);
    st__free_table(visitedTable);
    ABC_FREE(size);
#if 0
    (void) Cudd_DebugCheck(dd);
    (void) Cudd_CheckKeys(dd);
#endif

    if (subset != NULL) {
#ifdef DD_DEBUG
      if (!Cudd_bddLeq(dd, subset, f)) {
            fprintf(dd->err, "Wrong subset\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
      }
#endif
        cuddDeref(subset);
        return(subset);
    } else {
        return(NULL);
    }
}